

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O0

void __thiscall
flatbuffers::ts::TsGenerator::GenObjApi
          (TsGenerator *this,Parser *parser,StructDef *struct_def,string *obj_api_unpack_func,
          string *obj_api_class,import_set *imports)

{
  string *__return_storage_ptr__;
  FieldDef *s;
  bool bVar1;
  char cVar2;
  reference ppFVar3;
  ulong uVar4;
  char *pcVar5;
  bool local_2c79;
  bool local_2c51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2bf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2bd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2bb8;
  string local_2b98;
  string local_2b78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2af8;
  __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_2ad8;
  FieldDef **local_2ad0;
  __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_2ac8;
  allocator<char> local_2ab9;
  string local_2ab8;
  string local_2a98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_29f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_29d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_29b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2998;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2978;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2958;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2938;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2918;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2898;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2878;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2858;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2838;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2818;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_27f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_27d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_27b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2798;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2778;
  string local_2758;
  string local_2738;
  allocator<char> local_2711;
  string local_2710;
  allocator<char> local_26e9;
  string local_26e8;
  string local_26c8;
  ImportDefinition local_26a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_25d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_25b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2598;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2578;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2558;
  allocator<char> local_2531;
  string local_2530;
  string local_2510;
  string local_24f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_24d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_24b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2410;
  string local_23f0;
  string local_23d0;
  allocator<char> local_23a9;
  string local_23a8;
  allocator<char> local_2381;
  string local_2380;
  string local_2360;
  ImportDefinition local_2340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_21f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_21d0;
  string local_21b0;
  string local_2190;
  string local_2170;
  allocator<char> local_2149;
  string local_2148;
  allocator<char> local_2121;
  string local_2120;
  string local_2100;
  ImportDefinition local_20e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2010;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ff0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1fd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1fb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f70;
  allocator<char> local_1f49;
  string local_1f48;
  string local_1f28;
  string local_1f08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e68;
  allocator<char> local_1e41;
  string local_1e40;
  allocator<char> local_1e19;
  string local_1e18;
  string local_1df8;
  ImportDefinition local_1dd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ce8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1cc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ca8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c68;
  allocator<char> local_1c41;
  string local_1c40;
  allocator<char> local_1c19;
  string local_1c18;
  string local_1bf8;
  ImportDefinition local_1bd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ae8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ac8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1aa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a68;
  allocator<char> local_1a41;
  string local_1a40;
  string local_1a20;
  string local_1a00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_19e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_19c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_19a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1980;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1960;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1940;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1920;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1900;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_18e0;
  undefined1 local_18c0 [8];
  string field_type_name_1;
  StructDef *sd_2;
  string vectortypename_1;
  Type vectortype_1;
  string local_1850;
  allocator<char> local_1829;
  string local_1828;
  string local_1808;
  ImportDefinition local_17e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1718;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_16f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_16d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_16b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1698;
  string local_1678;
  string local_1658;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1638;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1618;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1598;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1578;
  string local_1558;
  string local_1538;
  allocator<char> local_1511;
  string local_1510;
  allocator<char> local_14e9;
  string local_14e8;
  string local_14c8;
  ImportDefinition local_14a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1338;
  string local_1318;
  string local_12f8;
  string local_12d8;
  allocator<char> local_12b1;
  string local_12b0;
  allocator<char> local_1289;
  string local_1288;
  string local_1268;
  ImportDefinition local_1248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10d8;
  allocator<char> local_10b1;
  string local_10b0;
  string local_1090;
  string local_1070;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1050;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1030;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1010;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ff0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fd0;
  allocator<char> local_fa9;
  string local_fa8;
  allocator<char> local_f81;
  string local_f80;
  string local_f60;
  ImportDefinition local_f40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_df0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dd0;
  allocator<char> local_da9;
  string local_da8;
  allocator<char> local_d81;
  string local_d80;
  string local_d60;
  ImportDefinition local_d40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bd0;
  string local_bb0;
  string local_b90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_af0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ad0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ab0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a70;
  undefined1 local_a50 [8];
  string field_type_name;
  StructDef *sd_1;
  string vectortypename;
  Type vectortype;
  string local_9e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_980;
  undefined1 local_960 [8];
  string packing;
  string local_938;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_918;
  string local_8f8;
  string local_8d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b8;
  undefined1 local_898 [8];
  string field_accessor;
  StructDef *local_7a8;
  StructDef *sd;
  undefined1 local_798 [6];
  bool is_vector;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_778;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_758;
  string local_738;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_718;
  string local_6f8;
  string local_6d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b8;
  string local_698;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_678;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_658;
  string local_638;
  bool local_612;
  byte local_611;
  undefined1 local_610 [6];
  bool has_null_default;
  bool is_string;
  string field_default_val;
  string field_offset_val;
  string field_offset_decl;
  string field_type;
  string field_val;
  undefined1 local_550 [8];
  string field_binded_method;
  string field_field;
  string field_method;
  FieldDef *field;
  __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_4e0;
  iterator it;
  string local_4d0;
  allocator<char> local_4a9;
  string local_4a8;
  string local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  string local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  string local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  ImportDefinition local_2e8;
  undefined1 local_218 [8];
  string struct_name;
  string pack_func_create_call;
  string pack_func_offset_decl;
  undefined1 local_1b0 [8];
  string pack_func_prototype;
  string local_188 [6];
  bool has_create;
  string constructor_func;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  undefined1 local_128 [8];
  string unpack_to_func;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_78 [8];
  string unpack_func;
  string class_name;
  import_set *imports_local;
  string *obj_api_class_local;
  string *obj_api_unpack_func_local;
  StructDef *struct_def_local;
  Parser *parser_local;
  TsGenerator *this_local;
  
  __return_storage_ptr__ = (string *)((long)&unpack_func.field_2 + 8);
  GetTypeName_abi_cxx11_(__return_storage_ptr__,this,struct_def,true,false);
  std::operator+(&local_f8,"\nunpack(): ",__return_storage_ptr__);
  std::operator+(&local_d8,&local_f8," {\n  return new ");
  std::operator+(&local_b8,&local_d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&unpack_func.field_2 + 8));
  std::operator+(&local_98,&local_b8,"(");
  bVar1 = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::empty
                    (&(struct_def->fields).vec);
  pcVar5 = "\n";
  if (bVar1) {
    pcVar5 = "";
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                 &local_98,pcVar5);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&constructor_func.field_2 + 8),"\nunpackTo(_o: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&unpack_func.field_2 + 8));
  std::operator+(&local_148,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&constructor_func.field_2 + 8),"): void {");
  bVar1 = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::empty
                    (&(struct_def->fields).vec);
  pcVar5 = "\n";
  if (bVar1) {
    pcVar5 = "";
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
                 &local_148,pcVar5);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)(constructor_func.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_188,"constructor(",
             (allocator<char> *)(pack_func_prototype.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(pack_func_prototype.field_2._M_local_buf + 0xf));
  bVar1 = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::empty
                    (&(struct_def->fields).vec);
  pcVar5 = "\n";
  if (bVar1) {
    pcVar5 = "";
  }
  std::__cxx11::string::operator+=(local_188,pcVar5);
  local_2c51 = true;
  if ((struct_def->fixed & 1U) == 0) {
    local_2c51 = CanCreateFactoryMethod(struct_def);
  }
  pack_func_prototype.field_2._M_local_buf[0xe] = local_2c51;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b0,"\npack(builder:flatbuffers.Builder): flatbuffers.Offset {\n",
             (allocator<char> *)(pack_func_offset_decl.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(pack_func_offset_decl.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)(pack_func_create_call.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(struct_name.field_2._M_local_buf + 8));
  AddImport<flatbuffers::StructDef>
            (&local_2e8,this,imports,&struct_def->super_Definition,struct_def);
  std::__cxx11::string::string((string *)local_218,(string *)&local_2e8);
  anon_unknown_10::ImportDefinition::~ImportDefinition(&local_2e8);
  if ((pack_func_prototype.field_2._M_local_buf[0xe] & 1U) == 0) {
    std::operator+(&local_428,"  ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218);
    std::operator+(&local_408,&local_428,".start");
    GetPrefixedName_abi_cxx11_(&local_448,this,struct_def,"");
    std::operator+(&local_3e8,&local_408,&local_448);
    std::operator+(&local_3c8,&local_3e8,"(builder);\n");
    std::__cxx11::string::operator=
              ((string *)(struct_name.field_2._M_local_buf + 8),(string *)&local_3c8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::__cxx11::string::~string((string *)&local_448);
    std::__cxx11::string::~string((string *)&local_408);
    std::__cxx11::string::~string((string *)&local_428);
  }
  else {
    std::operator+(&local_388,"  return ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218);
    std::operator+(&local_368,&local_388,".create");
    GetPrefixedName_abi_cxx11_(&local_3a8,this,struct_def,"");
    std::operator+(&local_348,&local_368,&local_3a8);
    std::operator+(&local_328,&local_348,"(builder");
    bVar1 = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::empty
                      (&(struct_def->fields).vec);
    pcVar5 = ",\n    ";
    if (bVar1) {
      pcVar5 = "";
    }
    std::operator+(&local_308,&local_328,pcVar5);
    std::__cxx11::string::operator=
              ((string *)(struct_name.field_2._M_local_buf + 8),(string *)&local_308);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_368);
    std::__cxx11::string::~string((string *)&local_388);
  }
  if ((struct_def->fixed & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a8,"this",&local_4a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4d0,",\n    ",(allocator<char> *)((long)&it._M_current + 7));
    GenStructMemberValueTS(&local_488,this,struct_def,&local_4a8,&local_4d0,false);
    std::operator+(&local_468,&local_488,"\n  ");
    std::__cxx11::string::operator+=
              ((string *)(struct_name.field_2._M_local_buf + 8),(string *)&local_468);
    std::__cxx11::string::~string((string *)&local_468);
    std::__cxx11::string::~string((string *)&local_488);
    std::__cxx11::string::~string((string *)&local_4d0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 7));
    std::__cxx11::string::~string((string *)&local_4a8);
    std::allocator<char>::~allocator(&local_4a9);
  }
  local_4e0._M_current =
       (FieldDef **)
       std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                 (&(struct_def->fields).vec);
  while( true ) {
    field = (FieldDef *)
            std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                      (&(struct_def->fields).vec);
    bVar1 = __gnu_cxx::operator!=
                      (&local_4e0,
                       (__normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                        *)&field);
    if (!bVar1) break;
    ppFVar3 = __gnu_cxx::
              __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
              ::operator*(&local_4e0);
    s = *ppFVar3;
    if ((s->deprecated & 1U) == 0) {
      Namer::Method<flatbuffers::FieldDef>
                ((string *)((long)&field_field.field_2 + 8),&(this->namer_).super_Namer,s);
      IdlNamer::Field_abi_cxx11_((string *)((long)&field_binded_method.field_2 + 8),&this->namer_,s)
      ;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&field_val.field_2 + 8),"this.",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&field_field.field_2 + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_550,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&field_val.field_2 + 8),".bind(this)");
      std::__cxx11::string::~string((string *)(field_val.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)(field_type.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)(field_offset_decl.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)(field_offset_val.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)(field_default_val.field_2._M_local_buf + 8));
      GenDefaultValue((string *)local_610,this,s,imports);
      local_611 = IsString(&(s->value).type);
      bVar1 = IsScalar((s->value).type.base_type);
      if ((bVar1) || ((local_611 & 1) != 0)) {
        local_2c79 = true;
        if ((local_611 & 1) == 0) {
          local_2c79 = HasNullDefault(s);
        }
        local_612 = local_2c79;
        GenTypeName(&local_638,this,imports,&s->super_Definition,&(s->value).type,false,local_2c79);
        std::__cxx11::string::operator+=
                  ((string *)(field_offset_decl.field_2._M_local_buf + 8),(string *)&local_638);
        std::__cxx11::string::~string((string *)&local_638);
        Namer::Method<flatbuffers::FieldDef>(&local_698,&(this->namer_).super_Namer,s);
        std::operator+(&local_678,"this.",&local_698);
        std::operator+(&local_658,&local_678,"()");
        std::__cxx11::string::operator=
                  ((string *)(field_type.field_2._M_local_buf + 8),(string *)&local_658);
        std::__cxx11::string::~string((string *)&local_658);
        std::__cxx11::string::~string((string *)&local_678);
        std::__cxx11::string::~string((string *)&local_698);
        if ((s->value).type.base_type == BASE_TYPE_STRING) {
          IdlNamer::Field_abi_cxx11_(&local_738,&this->namer_,s);
          std::operator+(&local_718,"this.",&local_738);
          std::operator+(&local_778,"builder.createString(this.",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&field_binded_method.field_2 + 8));
          std::operator+(&local_758,&local_778,"!)");
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_798,"0",(allocator<char> *)((long)&sd + 7));
          GenNullCheckConditional(&local_6f8,&local_718,&local_758,(string *)local_798);
          std::__cxx11::string::operator=
                    ((string *)(field_offset_val.field_2._M_local_buf + 8),(string *)&local_6f8);
          std::__cxx11::string::~string((string *)&local_6f8);
          std::__cxx11::string::~string((string *)local_798);
          std::allocator<char>::~allocator((allocator<char> *)((long)&sd + 7));
          std::__cxx11::string::~string((string *)&local_758);
          std::__cxx11::string::~string((string *)&local_778);
          std::__cxx11::string::~string((string *)&local_718);
          std::__cxx11::string::~string((string *)&local_738);
        }
        else {
          IdlNamer::Field_abi_cxx11_(&local_6d8,&this->namer_,s);
          std::operator+(&local_6b8,"this.",&local_6d8);
          std::__cxx11::string::operator=
                    ((string *)(field_default_val.field_2._M_local_buf + 8),(string *)&local_6b8);
          std::__cxx11::string::~string((string *)&local_6b8);
          std::__cxx11::string::~string((string *)&local_6d8);
        }
      }
      else {
        sd._6_1_ = 0;
        switch((s->value).type.base_type) {
        case BASE_TYPE_VECTOR:
          Type::VectorType((Type *)((long)&vectortypename_1.field_2 + 8),&(s->value).type);
          GenTypeName((string *)&sd_2,this,imports,&struct_def->super_Definition,
                      (Type *)((long)&vectortypename_1.field_2 + 8),false,false);
          sd._6_1_ = 1;
          std::__cxx11::string::operator=
                    ((string *)(field_offset_decl.field_2._M_local_buf + 8),"(");
          if (vectortypename_1.field_2._8_4_ == 0xd) {
            std::__cxx11::string::operator+=
                      ((string *)(field_offset_decl.field_2._M_local_buf + 8),"string)[]");
            GenBBAccess_abi_cxx11_(&local_1f08,this);
            std::operator+(&local_1ee8,&local_1f08,".createScalarList<string>(");
            std::operator+(&local_1ec8,&local_1ee8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_550);
            std::operator+(&local_1ea8,&local_1ec8,", this.");
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1f48,"Length",&local_1f49);
            IdlNamer::Field(&local_1f28,&this->namer_,s,&local_1f48);
            std::operator+(&local_1e88,&local_1ea8,&local_1f28);
            std::operator+(&local_1e68,&local_1e88,"())");
            std::__cxx11::string::operator=
                      ((string *)(field_type.field_2._M_local_buf + 8),(string *)&local_1e68);
            std::__cxx11::string::~string((string *)&local_1e68);
            std::__cxx11::string::~string((string *)&local_1e88);
            std::__cxx11::string::~string((string *)&local_1f28);
            std::__cxx11::string::~string((string *)&local_1f48);
            std::allocator<char>::~allocator(&local_1f49);
            std::__cxx11::string::~string((string *)&local_1ea8);
            std::__cxx11::string::~string((string *)&local_1ec8);
            std::__cxx11::string::~string((string *)&local_1ee8);
            std::__cxx11::string::~string((string *)&local_1f08);
            AddImport<flatbuffers::StructDef>
                      (&local_20e0,this,imports,&struct_def->super_Definition,struct_def);
            std::operator+(&local_2010,&local_20e0.name,".");
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2120,"create",&local_2121);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2148,"Vector",&local_2149);
            IdlNamer::Method(&local_2100,&this->namer_,&local_2120,s,&local_2148);
            std::operator+(&local_1ff0,&local_2010,&local_2100);
            std::operator+(&local_1fd0,&local_1ff0,"(builder, builder.createObjectOffsetList(");
            std::operator+(&local_1fb0,&local_1fd0,"this.");
            IdlNamer::Field_abi_cxx11_(&local_2170,&this->namer_,s);
            std::operator+(&local_1f90,&local_1fb0,&local_2170);
            std::operator+(&local_1f70,&local_1f90,"))");
            std::__cxx11::string::operator=
                      ((string *)(field_offset_val.field_2._M_local_buf + 8),(string *)&local_1f70);
            std::__cxx11::string::~string((string *)&local_1f70);
            std::__cxx11::string::~string((string *)&local_1f90);
            std::__cxx11::string::~string((string *)&local_2170);
            std::__cxx11::string::~string((string *)&local_1fb0);
            std::__cxx11::string::~string((string *)&local_1fd0);
            std::__cxx11::string::~string((string *)&local_1ff0);
            std::__cxx11::string::~string((string *)&local_2100);
            std::__cxx11::string::~string((string *)&local_2148);
            std::allocator<char>::~allocator(&local_2149);
            std::__cxx11::string::~string((string *)&local_2120);
            std::allocator<char>::~allocator(&local_2121);
            std::__cxx11::string::~string((string *)&local_2010);
            anon_unknown_10::ImportDefinition::~ImportDefinition(&local_20e0);
          }
          else if (vectortypename_1.field_2._8_4_ == 0xf) {
            field_type_name_1.field_2._8_8_ = (s->value).type.struct_def;
            GetTypeName_abi_cxx11_
                      ((string *)local_18c0,this,(StructDef *)field_type_name_1.field_2._8_8_,true,
                       false);
            std::__cxx11::string::operator+=
                      ((string *)(field_offset_decl.field_2._M_local_buf + 8),(string *)local_18c0);
            std::__cxx11::string::operator+=
                      ((string *)(field_offset_decl.field_2._M_local_buf + 8),")[]");
            GenBBAccess_abi_cxx11_(&local_1a00,this);
            std::operator+(&local_19e0,&local_1a00,".createObjList<");
            std::operator+(&local_19c0,&local_19e0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &sd_2);
            std::operator+(&local_19a0,&local_19c0,", ");
            std::operator+(&local_1980,&local_19a0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_18c0);
            std::operator+(&local_1960,&local_1980,">(");
            std::operator+(&local_1940,&local_1960,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_550);
            std::operator+(&local_1920,&local_1940,", this.");
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1a40,"Length",&local_1a41);
            IdlNamer::Method(&local_1a20,&this->namer_,s,&local_1a40);
            std::operator+(&local_1900,&local_1920,&local_1a20);
            std::operator+(&local_18e0,&local_1900,"())");
            std::__cxx11::string::operator=
                      ((string *)(field_type.field_2._M_local_buf + 8),(string *)&local_18e0);
            std::__cxx11::string::~string((string *)&local_18e0);
            std::__cxx11::string::~string((string *)&local_1900);
            std::__cxx11::string::~string((string *)&local_1a20);
            std::__cxx11::string::~string((string *)&local_1a40);
            std::allocator<char>::~allocator(&local_1a41);
            std::__cxx11::string::~string((string *)&local_1920);
            std::__cxx11::string::~string((string *)&local_1940);
            std::__cxx11::string::~string((string *)&local_1960);
            std::__cxx11::string::~string((string *)&local_1980);
            std::__cxx11::string::~string((string *)&local_19a0);
            std::__cxx11::string::~string((string *)&local_19c0);
            std::__cxx11::string::~string((string *)&local_19e0);
            std::__cxx11::string::~string((string *)&local_1a00);
            if ((*(byte *)(field_type_name_1.field_2._8_8_ + 0x110) & 1) == 0) {
              AddImport<flatbuffers::StructDef>
                        (&local_1dd8,this,imports,&struct_def->super_Definition,struct_def);
              std::operator+(&local_1d08,&local_1dd8.name,".");
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1e18,"create",&local_1e19);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1e40,"Vector",&local_1e41);
              IdlNamer::Method(&local_1df8,&this->namer_,&local_1e18,s,&local_1e40);
              std::operator+(&local_1ce8,&local_1d08,&local_1df8);
              std::operator+(&local_1cc8,&local_1ce8,"(builder, builder.createObjectOffsetList(");
              std::operator+(&local_1ca8,&local_1cc8,"this.");
              std::operator+(&local_1c88,&local_1ca8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&field_binded_method.field_2 + 8));
              std::operator+(&local_1c68,&local_1c88,"))");
              std::__cxx11::string::operator=
                        ((string *)(field_offset_val.field_2._M_local_buf + 8),(string *)&local_1c68
                        );
              std::__cxx11::string::~string((string *)&local_1c68);
              std::__cxx11::string::~string((string *)&local_1c88);
              std::__cxx11::string::~string((string *)&local_1ca8);
              std::__cxx11::string::~string((string *)&local_1cc8);
              std::__cxx11::string::~string((string *)&local_1ce8);
              std::__cxx11::string::~string((string *)&local_1df8);
              std::__cxx11::string::~string((string *)&local_1e40);
              std::allocator<char>::~allocator(&local_1e41);
              std::__cxx11::string::~string((string *)&local_1e18);
              std::allocator<char>::~allocator(&local_1e19);
              std::__cxx11::string::~string((string *)&local_1d08);
              anon_unknown_10::ImportDefinition::~ImportDefinition(&local_1dd8);
            }
            else {
              std::operator+(&local_1b08,"builder.createStructOffsetList(this.",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&field_binded_method.field_2 + 8));
              std::operator+(&local_1ae8,&local_1b08,", ");
              AddImport<flatbuffers::StructDef>
                        (&local_1bd8,this,imports,&struct_def->super_Definition,struct_def);
              std::operator+(&local_1ac8,&local_1ae8,&local_1bd8.name);
              std::operator+(&local_1aa8,&local_1ac8,".");
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1c18,"start",&local_1c19);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1c40,"Vector",&local_1c41);
              IdlNamer::Method(&local_1bf8,&this->namer_,&local_1c18,s,&local_1c40);
              std::operator+(&local_1a88,&local_1aa8,&local_1bf8);
              std::operator+(&local_1a68,&local_1a88,")");
              std::__cxx11::string::operator=
                        ((string *)(field_offset_val.field_2._M_local_buf + 8),(string *)&local_1a68
                        );
              std::__cxx11::string::~string((string *)&local_1a68);
              std::__cxx11::string::~string((string *)&local_1a88);
              std::__cxx11::string::~string((string *)&local_1bf8);
              std::__cxx11::string::~string((string *)&local_1c40);
              std::allocator<char>::~allocator(&local_1c41);
              std::__cxx11::string::~string((string *)&local_1c18);
              std::allocator<char>::~allocator(&local_1c19);
              std::__cxx11::string::~string((string *)&local_1aa8);
              std::__cxx11::string::~string((string *)&local_1ac8);
              anon_unknown_10::ImportDefinition::~ImportDefinition(&local_1bd8);
              std::__cxx11::string::~string((string *)&local_1ae8);
              std::__cxx11::string::~string((string *)&local_1b08);
            }
            std::__cxx11::string::~string((string *)local_18c0);
          }
          else if (vectortypename_1.field_2._8_4_ == 0x10) {
            GenObjApiUnionTypeTS
                      (&local_2190,this,imports,struct_def,&parser->opts,
                       (EnumDef *)vectortype_1.struct_def);
            std::__cxx11::string::operator+=
                      ((string *)(field_offset_decl.field_2._M_local_buf + 8),(string *)&local_2190)
            ;
            std::__cxx11::string::~string((string *)&local_2190);
            std::__cxx11::string::operator+=
                      ((string *)(field_offset_decl.field_2._M_local_buf + 8),")[]");
            GenUnionValTS(&local_21b0,this,imports,struct_def,
                          (string *)((long)&field_field.field_2 + 8),
                          (Type *)((long)&vectortypename_1.field_2 + 8),true);
            std::__cxx11::string::operator=
                      ((string *)(field_type.field_2._M_local_buf + 8),(string *)&local_21b0);
            std::__cxx11::string::~string((string *)&local_21b0);
            AddImport<flatbuffers::StructDef>
                      (&local_2340,this,imports,&struct_def->super_Definition,struct_def);
            std::operator+(&local_2270,&local_2340.name,".");
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2380,"create",&local_2381);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_23a8,"Vector",&local_23a9);
            IdlNamer::Method(&local_2360,&this->namer_,&local_2380,s,&local_23a8);
            std::operator+(&local_2250,&local_2270,&local_2360);
            std::operator+(&local_2230,&local_2250,"(builder, builder.createObjectOffsetList(");
            std::operator+(&local_2210,&local_2230,"this.");
            IdlNamer::Field_abi_cxx11_(&local_23d0,&this->namer_,s);
            std::operator+(&local_21f0,&local_2210,&local_23d0);
            std::operator+(&local_21d0,&local_21f0,"))");
            std::__cxx11::string::operator=
                      ((string *)(field_offset_val.field_2._M_local_buf + 8),(string *)&local_21d0);
            std::__cxx11::string::~string((string *)&local_21d0);
            std::__cxx11::string::~string((string *)&local_21f0);
            std::__cxx11::string::~string((string *)&local_23d0);
            std::__cxx11::string::~string((string *)&local_2210);
            std::__cxx11::string::~string((string *)&local_2230);
            std::__cxx11::string::~string((string *)&local_2250);
            std::__cxx11::string::~string((string *)&local_2360);
            std::__cxx11::string::~string((string *)&local_23a8);
            std::allocator<char>::~allocator(&local_23a9);
            std::__cxx11::string::~string((string *)&local_2380);
            std::allocator<char>::~allocator(&local_2381);
            std::__cxx11::string::~string((string *)&local_2270);
            anon_unknown_10::ImportDefinition::~ImportDefinition(&local_2340);
          }
          else {
            if (vectortype_1.struct_def == (StructDef *)0x0) {
              std::__cxx11::string::operator+=
                        ((string *)(field_offset_decl.field_2._M_local_buf + 8),(string *)&sd_2);
            }
            else {
              bVar1 = HasNullDefault(s);
              GenTypeName(&local_23f0,this,imports,&struct_def->super_Definition,
                          (Type *)((long)&vectortypename_1.field_2 + 8),false,bVar1);
              std::__cxx11::string::operator+=
                        ((string *)(field_offset_decl.field_2._M_local_buf + 8),
                         (string *)&local_23f0);
              std::__cxx11::string::~string((string *)&local_23f0);
            }
            std::__cxx11::string::operator+=
                      ((string *)(field_offset_decl.field_2._M_local_buf + 8),")[]");
            GenBBAccess_abi_cxx11_(&local_24f0,this);
            std::operator+(&local_24d0,&local_24f0,".createScalarList<");
            std::operator+(&local_24b0,&local_24d0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &sd_2);
            std::operator+(&local_2490,&local_24b0,">(");
            std::operator+(&local_2470,&local_2490,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_550);
            std::operator+(&local_2450,&local_2470,", this.");
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2530,"Length",&local_2531);
            IdlNamer::Method(&local_2510,&this->namer_,s,&local_2530);
            std::operator+(&local_2430,&local_2450,&local_2510);
            std::operator+(&local_2410,&local_2430,"())");
            std::__cxx11::string::operator=
                      ((string *)(field_type.field_2._M_local_buf + 8),(string *)&local_2410);
            std::__cxx11::string::~string((string *)&local_2410);
            std::__cxx11::string::~string((string *)&local_2430);
            std::__cxx11::string::~string((string *)&local_2510);
            std::__cxx11::string::~string((string *)&local_2530);
            std::allocator<char>::~allocator(&local_2531);
            std::__cxx11::string::~string((string *)&local_2450);
            std::__cxx11::string::~string((string *)&local_2470);
            std::__cxx11::string::~string((string *)&local_2490);
            std::__cxx11::string::~string((string *)&local_24b0);
            std::__cxx11::string::~string((string *)&local_24d0);
            std::__cxx11::string::~string((string *)&local_24f0);
            AddImport<flatbuffers::StructDef>
                      (&local_26a8,this,imports,&struct_def->super_Definition,struct_def);
            std::operator+(&local_25d8,&local_26a8.name,".");
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_26e8,"create",&local_26e9);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2710,"Vector",&local_2711);
            IdlNamer::Method(&local_26c8,&this->namer_,&local_26e8,s,&local_2710);
            std::operator+(&local_25b8,&local_25d8,&local_26c8);
            std::operator+(&local_2598,&local_25b8,"(builder, this.");
            std::operator+(&local_2578,&local_2598,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&field_binded_method.field_2 + 8));
            std::operator+(&local_2558,&local_2578,")");
            std::__cxx11::string::operator=
                      ((string *)(field_offset_val.field_2._M_local_buf + 8),(string *)&local_2558);
            std::__cxx11::string::~string((string *)&local_2558);
            std::__cxx11::string::~string((string *)&local_2578);
            std::__cxx11::string::~string((string *)&local_2598);
            std::__cxx11::string::~string((string *)&local_25b8);
            std::__cxx11::string::~string((string *)&local_26c8);
            std::__cxx11::string::~string((string *)&local_2710);
            std::allocator<char>::~allocator(&local_2711);
            std::__cxx11::string::~string((string *)&local_26e8);
            std::allocator<char>::~allocator(&local_26e9);
            std::__cxx11::string::~string((string *)&local_25d8);
            anon_unknown_10::ImportDefinition::~ImportDefinition(&local_26a8);
          }
          std::__cxx11::string::~string((string *)&sd_2);
          break;
        case BASE_TYPE_STRUCT:
          local_7a8 = (s->value).type.struct_def;
          AddImport<flatbuffers::StructDef>
                    ((ImportDefinition *)((long)&field_accessor.field_2 + 8),this,imports,
                     &struct_def->super_Definition,local_7a8);
          std::__cxx11::string::operator+=
                    ((string *)(field_offset_decl.field_2._M_local_buf + 8),
                     (string *)&stack0xfffffffffffff828);
          anon_unknown_10::ImportDefinition::~ImportDefinition
                    ((ImportDefinition *)((long)&field_accessor.field_2 + 8));
          Namer::Method<flatbuffers::FieldDef>(&local_8d8,&(this->namer_).super_Namer,s);
          std::operator+(&local_8b8,"this.",&local_8d8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_898,&local_8b8,"()");
          std::__cxx11::string::~string((string *)&local_8b8);
          std::__cxx11::string::~string((string *)&local_8d8);
          std::operator+(&local_918,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_898,"!.unpack()");
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_938,"null",
                     (allocator<char> *)(packing.field_2._M_local_buf + 0xf));
          GenNullCheckConditional(&local_8f8,(string *)local_898,&local_918,&local_938);
          std::__cxx11::string::operator=
                    ((string *)(field_type.field_2._M_local_buf + 8),(string *)&local_8f8);
          std::__cxx11::string::~string((string *)&local_8f8);
          std::__cxx11::string::~string((string *)&local_938);
          std::allocator<char>::~allocator((allocator<char> *)(packing.field_2._M_local_buf + 0xf));
          std::__cxx11::string::~string((string *)&local_918);
          std::operator+(&local_980,"this.",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&field_binded_method.field_2 + 8));
          std::operator+(&local_9c0,"this.",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&field_binded_method.field_2 + 8));
          std::operator+(&local_9a0,&local_9c0,"!.pack(builder)");
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_9e0,"0",(allocator<char> *)&vectortype.field_0x1f);
          GenNullCheckConditional((string *)local_960,&local_980,&local_9a0,&local_9e0);
          std::__cxx11::string::~string((string *)&local_9e0);
          std::allocator<char>::~allocator((allocator<char> *)&vectortype.field_0x1f);
          std::__cxx11::string::~string((string *)&local_9a0);
          std::__cxx11::string::~string((string *)&local_9c0);
          std::__cxx11::string::~string((string *)&local_980);
          if ((local_7a8->fixed & 1U) == 0) {
            std::__cxx11::string::operator=
                      ((string *)(field_offset_val.field_2._M_local_buf + 8),(string *)local_960);
          }
          else {
            std::__cxx11::string::operator=
                      ((string *)(field_default_val.field_2._M_local_buf + 8),(string *)local_960);
          }
          std::__cxx11::string::~string((string *)local_960);
          std::__cxx11::string::~string((string *)local_898);
          break;
        case BASE_TYPE_UNION:
          GenObjApiUnionTypeTS
                    (&local_2738,this,imports,struct_def,&parser->opts,(s->value).type.enum_def);
          std::__cxx11::string::operator+=
                    ((string *)(field_offset_decl.field_2._M_local_buf + 8),(string *)&local_2738);
          std::__cxx11::string::~string((string *)&local_2738);
          GenUnionValTS(&local_2758,this,imports,struct_def,
                        (string *)((long)&field_field.field_2 + 8),&(s->value).type,false);
          std::__cxx11::string::operator=
                    ((string *)(field_type.field_2._M_local_buf + 8),(string *)&local_2758);
          std::__cxx11::string::~string((string *)&local_2758);
          std::operator+(&local_2798,"builder.createObjectOffset(this.",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&field_binded_method.field_2 + 8));
          std::operator+(&local_2778,&local_2798,")");
          std::__cxx11::string::operator=
                    ((string *)(field_offset_val.field_2._M_local_buf + 8),(string *)&local_2778);
          std::__cxx11::string::~string((string *)&local_2778);
          std::__cxx11::string::~string((string *)&local_2798);
          break;
        case BASE_TYPE_ARRAY:
          Type::VectorType((Type *)((long)&vectortypename.field_2 + 8),&(s->value).type);
          GenTypeName((string *)&sd_1,this,imports,&struct_def->super_Definition,
                      (Type *)((long)&vectortypename.field_2 + 8),false,false);
          sd._6_1_ = 1;
          std::__cxx11::string::operator=
                    ((string *)(field_offset_decl.field_2._M_local_buf + 8),"(");
          if (vectortypename.field_2._8_4_ == 0xd) {
            std::__cxx11::string::operator+=
                      ((string *)(field_offset_decl.field_2._M_local_buf + 8),"string)[]");
            GenBBAccess_abi_cxx11_(&local_1070,this);
            std::operator+(&local_1050,&local_1070,".createScalarList<string>(");
            std::operator+(&local_1030,&local_1050,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_550);
            std::operator+(&local_1010,&local_1030,", this.");
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_10b0,"Length",&local_10b1);
            IdlNamer::Field(&local_1090,&this->namer_,s,&local_10b0);
            std::operator+(&local_ff0,&local_1010,&local_1090);
            std::operator+(&local_fd0,&local_ff0,"())");
            std::__cxx11::string::operator=
                      ((string *)(field_type.field_2._M_local_buf + 8),(string *)&local_fd0);
            std::__cxx11::string::~string((string *)&local_fd0);
            std::__cxx11::string::~string((string *)&local_ff0);
            std::__cxx11::string::~string((string *)&local_1090);
            std::__cxx11::string::~string((string *)&local_10b0);
            std::allocator<char>::~allocator(&local_10b1);
            std::__cxx11::string::~string((string *)&local_1010);
            std::__cxx11::string::~string((string *)&local_1030);
            std::__cxx11::string::~string((string *)&local_1050);
            std::__cxx11::string::~string((string *)&local_1070);
            AddImport<flatbuffers::StructDef>
                      (&local_1248,this,imports,&struct_def->super_Definition,struct_def);
            std::operator+(&local_1178,&local_1248.name,".");
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1288,"create",&local_1289);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_12b0,"Vector",&local_12b1);
            IdlNamer::Method(&local_1268,&this->namer_,&local_1288,s,&local_12b0);
            std::operator+(&local_1158,&local_1178,&local_1268);
            std::operator+(&local_1138,&local_1158,"(builder, builder.createObjectOffsetList(");
            std::operator+(&local_1118,&local_1138,"this.");
            IdlNamer::Field_abi_cxx11_(&local_12d8,&this->namer_,s);
            std::operator+(&local_10f8,&local_1118,&local_12d8);
            std::operator+(&local_10d8,&local_10f8,"))");
            std::__cxx11::string::operator=
                      ((string *)(field_offset_val.field_2._M_local_buf + 8),(string *)&local_10d8);
            std::__cxx11::string::~string((string *)&local_10d8);
            std::__cxx11::string::~string((string *)&local_10f8);
            std::__cxx11::string::~string((string *)&local_12d8);
            std::__cxx11::string::~string((string *)&local_1118);
            std::__cxx11::string::~string((string *)&local_1138);
            std::__cxx11::string::~string((string *)&local_1158);
            std::__cxx11::string::~string((string *)&local_1268);
            std::__cxx11::string::~string((string *)&local_12b0);
            std::allocator<char>::~allocator(&local_12b1);
            std::__cxx11::string::~string((string *)&local_1288);
            std::allocator<char>::~allocator(&local_1289);
            std::__cxx11::string::~string((string *)&local_1178);
            anon_unknown_10::ImportDefinition::~ImportDefinition(&local_1248);
          }
          else if (vectortypename.field_2._8_4_ == 0xf) {
            field_type_name.field_2._8_8_ = (s->value).type.struct_def;
            GetTypeName_abi_cxx11_
                      ((string *)local_a50,this,(StructDef *)field_type_name.field_2._8_8_,true,
                       false);
            std::__cxx11::string::operator+=
                      ((string *)(field_offset_decl.field_2._M_local_buf + 8),(string *)local_a50);
            std::__cxx11::string::operator+=
                      ((string *)(field_offset_decl.field_2._M_local_buf + 8),")[]");
            GenBBAccess_abi_cxx11_(&local_b90,this);
            std::operator+(&local_b70,&local_b90,".createObjList<");
            std::operator+(&local_b50,&local_b70,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &sd_1);
            std::operator+(&local_b30,&local_b50,", ");
            std::operator+(&local_b10,&local_b30,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_a50);
            std::operator+(&local_af0,&local_b10,">(");
            std::operator+(&local_ad0,&local_af0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_550);
            std::operator+(&local_ab0,&local_ad0,", ");
            NumToString<unsigned_short>(&local_bb0,(s->value).type.fixed_length);
            std::operator+(&local_a90,&local_ab0,&local_bb0);
            std::operator+(&local_a70,&local_a90,")");
            std::__cxx11::string::operator=
                      ((string *)(field_type.field_2._M_local_buf + 8),(string *)&local_a70);
            std::__cxx11::string::~string((string *)&local_a70);
            std::__cxx11::string::~string((string *)&local_a90);
            std::__cxx11::string::~string((string *)&local_bb0);
            std::__cxx11::string::~string((string *)&local_ab0);
            std::__cxx11::string::~string((string *)&local_ad0);
            std::__cxx11::string::~string((string *)&local_af0);
            std::__cxx11::string::~string((string *)&local_b10);
            std::__cxx11::string::~string((string *)&local_b30);
            std::__cxx11::string::~string((string *)&local_b50);
            std::__cxx11::string::~string((string *)&local_b70);
            std::__cxx11::string::~string((string *)&local_b90);
            if ((*(byte *)(field_type_name.field_2._8_8_ + 0x110) & 1) == 0) {
              AddImport<flatbuffers::StructDef>
                        (&local_f40,this,imports,&struct_def->super_Definition,struct_def);
              std::operator+(&local_e70,&local_f40.name,".");
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_f80,"create",&local_f81);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_fa8,"Vector",&local_fa9);
              IdlNamer::Method(&local_f60,&this->namer_,&local_f80,s,&local_fa8);
              std::operator+(&local_e50,&local_e70,&local_f60);
              std::operator+(&local_e30,&local_e50,"(builder, builder.createObjectOffsetList(");
              std::operator+(&local_e10,&local_e30,"this.");
              std::operator+(&local_df0,&local_e10,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&field_binded_method.field_2 + 8));
              std::operator+(&local_dd0,&local_df0,"))");
              std::__cxx11::string::operator=
                        ((string *)(field_offset_val.field_2._M_local_buf + 8),(string *)&local_dd0)
              ;
              std::__cxx11::string::~string((string *)&local_dd0);
              std::__cxx11::string::~string((string *)&local_df0);
              std::__cxx11::string::~string((string *)&local_e10);
              std::__cxx11::string::~string((string *)&local_e30);
              std::__cxx11::string::~string((string *)&local_e50);
              std::__cxx11::string::~string((string *)&local_f60);
              std::__cxx11::string::~string((string *)&local_fa8);
              std::allocator<char>::~allocator(&local_fa9);
              std::__cxx11::string::~string((string *)&local_f80);
              std::allocator<char>::~allocator(&local_f81);
              std::__cxx11::string::~string((string *)&local_e70);
              anon_unknown_10::ImportDefinition::~ImportDefinition(&local_f40);
            }
            else {
              std::operator+(&local_c70,"builder.createStructOffsetList(this.",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&field_binded_method.field_2 + 8));
              std::operator+(&local_c50,&local_c70,", ");
              AddImport<flatbuffers::StructDef>
                        (&local_d40,this,imports,&struct_def->super_Definition,struct_def);
              std::operator+(&local_c30,&local_c50,&local_d40.name);
              std::operator+(&local_c10,&local_c30,".");
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_d80,"start",&local_d81);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_da8,"Vector",&local_da9);
              IdlNamer::Method(&local_d60,&this->namer_,&local_d80,s,&local_da8);
              std::operator+(&local_bf0,&local_c10,&local_d60);
              std::operator+(&local_bd0,&local_bf0,")");
              std::__cxx11::string::operator=
                        ((string *)(field_offset_val.field_2._M_local_buf + 8),(string *)&local_bd0)
              ;
              std::__cxx11::string::~string((string *)&local_bd0);
              std::__cxx11::string::~string((string *)&local_bf0);
              std::__cxx11::string::~string((string *)&local_d60);
              std::__cxx11::string::~string((string *)&local_da8);
              std::allocator<char>::~allocator(&local_da9);
              std::__cxx11::string::~string((string *)&local_d80);
              std::allocator<char>::~allocator(&local_d81);
              std::__cxx11::string::~string((string *)&local_c10);
              std::__cxx11::string::~string((string *)&local_c30);
              anon_unknown_10::ImportDefinition::~ImportDefinition(&local_d40);
              std::__cxx11::string::~string((string *)&local_c50);
              std::__cxx11::string::~string((string *)&local_c70);
            }
            std::__cxx11::string::~string((string *)local_a50);
          }
          else if (vectortypename.field_2._8_4_ == 0x10) {
            GenObjApiUnionTypeTS
                      (&local_12f8,this,imports,struct_def,&parser->opts,
                       (EnumDef *)vectortype.struct_def);
            std::__cxx11::string::operator+=
                      ((string *)(field_offset_decl.field_2._M_local_buf + 8),(string *)&local_12f8)
            ;
            std::__cxx11::string::~string((string *)&local_12f8);
            std::__cxx11::string::operator+=
                      ((string *)(field_offset_decl.field_2._M_local_buf + 8),")[]");
            GenUnionValTS(&local_1318,this,imports,struct_def,
                          (string *)((long)&field_field.field_2 + 8),
                          (Type *)((long)&vectortypename.field_2 + 8),true);
            std::__cxx11::string::operator=
                      ((string *)(field_type.field_2._M_local_buf + 8),(string *)&local_1318);
            std::__cxx11::string::~string((string *)&local_1318);
            AddImport<flatbuffers::StructDef>
                      (&local_14a8,this,imports,&struct_def->super_Definition,struct_def);
            std::operator+(&local_13d8,&local_14a8.name,".");
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_14e8,"create",&local_14e9);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1510,"Vector",&local_1511);
            IdlNamer::Method(&local_14c8,&this->namer_,&local_14e8,s,&local_1510);
            std::operator+(&local_13b8,&local_13d8,&local_14c8);
            std::operator+(&local_1398,&local_13b8,"(builder, builder.createObjectOffsetList(");
            std::operator+(&local_1378,&local_1398,"this.");
            IdlNamer::Field_abi_cxx11_(&local_1538,&this->namer_,s);
            std::operator+(&local_1358,&local_1378,&local_1538);
            std::operator+(&local_1338,&local_1358,"))");
            std::__cxx11::string::operator=
                      ((string *)(field_offset_val.field_2._M_local_buf + 8),(string *)&local_1338);
            std::__cxx11::string::~string((string *)&local_1338);
            std::__cxx11::string::~string((string *)&local_1358);
            std::__cxx11::string::~string((string *)&local_1538);
            std::__cxx11::string::~string((string *)&local_1378);
            std::__cxx11::string::~string((string *)&local_1398);
            std::__cxx11::string::~string((string *)&local_13b8);
            std::__cxx11::string::~string((string *)&local_14c8);
            std::__cxx11::string::~string((string *)&local_1510);
            std::allocator<char>::~allocator(&local_1511);
            std::__cxx11::string::~string((string *)&local_14e8);
            std::allocator<char>::~allocator(&local_14e9);
            std::__cxx11::string::~string((string *)&local_13d8);
            anon_unknown_10::ImportDefinition::~ImportDefinition(&local_14a8);
          }
          else {
            if (vectortype.struct_def == (StructDef *)0x0) {
              std::__cxx11::string::operator+=
                        ((string *)(field_offset_decl.field_2._M_local_buf + 8),(string *)&sd_1);
            }
            else {
              bVar1 = HasNullDefault(s);
              GenTypeName(&local_1558,this,imports,&struct_def->super_Definition,
                          (Type *)((long)&vectortypename.field_2 + 8),false,bVar1);
              std::__cxx11::string::operator+=
                        ((string *)(field_offset_decl.field_2._M_local_buf + 8),
                         (string *)&local_1558);
              std::__cxx11::string::~string((string *)&local_1558);
            }
            std::__cxx11::string::operator+=
                      ((string *)(field_offset_decl.field_2._M_local_buf + 8),")[]");
            GenBBAccess_abi_cxx11_(&local_1658,this);
            std::operator+(&local_1638,&local_1658,".createScalarList<");
            std::operator+(&local_1618,&local_1638,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &sd_1);
            std::operator+(&local_15f8,&local_1618,">(");
            std::operator+(&local_15d8,&local_15f8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_550);
            std::operator+(&local_15b8,&local_15d8,", ");
            NumToString<unsigned_short>(&local_1678,(s->value).type.fixed_length);
            std::operator+(&local_1598,&local_15b8,&local_1678);
            std::operator+(&local_1578,&local_1598,")");
            std::__cxx11::string::operator=
                      ((string *)(field_type.field_2._M_local_buf + 8),(string *)&local_1578);
            std::__cxx11::string::~string((string *)&local_1578);
            std::__cxx11::string::~string((string *)&local_1598);
            std::__cxx11::string::~string((string *)&local_1678);
            std::__cxx11::string::~string((string *)&local_15b8);
            std::__cxx11::string::~string((string *)&local_15d8);
            std::__cxx11::string::~string((string *)&local_15f8);
            std::__cxx11::string::~string((string *)&local_1618);
            std::__cxx11::string::~string((string *)&local_1638);
            std::__cxx11::string::~string((string *)&local_1658);
            AddImport<flatbuffers::StructDef>
                      (&local_17e8,this,imports,&struct_def->super_Definition,struct_def);
            std::operator+(&local_1718,&local_17e8.name,".");
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1828,"create",&local_1829);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1850,"Vector",(allocator<char> *)&vectortype_1.field_0x1f);
            IdlNamer::Method(&local_1808,&this->namer_,&local_1828,s,&local_1850);
            std::operator+(&local_16f8,&local_1718,&local_1808);
            std::operator+(&local_16d8,&local_16f8,"(builder, this.");
            std::operator+(&local_16b8,&local_16d8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&field_binded_method.field_2 + 8));
            std::operator+(&local_1698,&local_16b8,")");
            std::__cxx11::string::operator=
                      ((string *)(field_offset_val.field_2._M_local_buf + 8),(string *)&local_1698);
            std::__cxx11::string::~string((string *)&local_1698);
            std::__cxx11::string::~string((string *)&local_16b8);
            std::__cxx11::string::~string((string *)&local_16d8);
            std::__cxx11::string::~string((string *)&local_16f8);
            std::__cxx11::string::~string((string *)&local_1808);
            std::__cxx11::string::~string((string *)&local_1850);
            std::allocator<char>::~allocator((allocator<char> *)&vectortype_1.field_0x1f);
            std::__cxx11::string::~string((string *)&local_1828);
            std::allocator<char>::~allocator(&local_1829);
            std::__cxx11::string::~string((string *)&local_1718);
            anon_unknown_10::ImportDefinition::~ImportDefinition(&local_17e8);
          }
          std::__cxx11::string::~string((string *)&sd_1);
          break;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_ts.cpp"
                        ,0x5ac,
                        "void flatbuffers::ts::TsGenerator::GenObjApi(const Parser &, StructDef &, std::string &, std::string &, import_set &)"
                       );
        }
        pcVar5 = "|null";
        if ((sd._6_1_ & 1) != 0) {
          pcVar5 = "";
        }
        std::__cxx11::string::operator+=
                  ((string *)(field_offset_decl.field_2._M_local_buf + 8),pcVar5);
      }
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        std::operator+(&local_2818,"  const ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&field_binded_method.field_2 + 8));
        std::operator+(&local_27f8,&local_2818," = ");
        std::operator+(&local_27d8,&local_27f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&field_offset_val.field_2 + 8));
        std::operator+(&local_27b8,&local_27d8,";");
        std::__cxx11::string::operator=
                  ((string *)(field_offset_val.field_2._M_local_buf + 8),(string *)&local_27b8);
        std::__cxx11::string::~string((string *)&local_27b8);
        std::__cxx11::string::~string((string *)&local_27d8);
        std::__cxx11::string::~string((string *)&local_27f8);
        std::__cxx11::string::~string((string *)&local_2818);
      }
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) != 0) {
        std::__cxx11::string::operator=
                  ((string *)(field_default_val.field_2._M_local_buf + 8),
                   (string *)(field_binded_method.field_2._M_local_buf + 8));
      }
      std::operator+(&local_2838,"    ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&field_type.field_2 + 8));
      std::__cxx11::string::operator+=((string *)local_78,(string *)&local_2838);
      std::__cxx11::string::~string((string *)&local_2838);
      std::operator+(&local_28b8,"  _o.",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&field_binded_method.field_2 + 8));
      std::operator+(&local_2898,&local_28b8," = ");
      std::operator+(&local_2878,&local_2898,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&field_type.field_2 + 8));
      std::operator+(&local_2858,&local_2878,";");
      std::__cxx11::string::operator+=((string *)local_128,(string *)&local_2858);
      std::__cxx11::string::~string((string *)&local_2858);
      std::__cxx11::string::~string((string *)&local_2878);
      std::__cxx11::string::~string((string *)&local_2898);
      std::__cxx11::string::~string((string *)&local_28b8);
      std::operator+(&local_2958,"  public ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&field_binded_method.field_2 + 8));
      std::operator+(&local_2938,&local_2958,": ");
      std::operator+(&local_2918,&local_2938,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&field_offset_decl.field_2 + 8));
      std::operator+(&local_28f8,&local_2918," = ");
      std::operator+(&local_28d8,&local_28f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_610)
      ;
      std::__cxx11::string::operator+=(local_188,(string *)&local_28d8);
      std::__cxx11::string::~string((string *)&local_28d8);
      std::__cxx11::string::~string((string *)&local_28f8);
      std::__cxx11::string::~string((string *)&local_2918);
      std::__cxx11::string::~string((string *)&local_2938);
      std::__cxx11::string::~string((string *)&local_2958);
      if ((struct_def->fixed & 1U) == 0) {
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          std::operator+(&local_2978,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&field_offset_val.field_2 + 8),"\n");
          std::__cxx11::string::operator+=
                    ((string *)(pack_func_create_call.field_2._M_local_buf + 8),
                     (string *)&local_2978);
          std::__cxx11::string::~string((string *)&local_2978);
        }
        if ((pack_func_prototype.field_2._M_local_buf[0xe] & 1U) == 0) {
          bVar1 = FieldDef::IsScalarOptional(s);
          if (bVar1) {
            std::operator+(&local_29b8,"  if (",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&field_default_val.field_2 + 8));
            std::operator+(&local_2998,&local_29b8," !== null)\n  ");
            std::__cxx11::string::operator+=
                      ((string *)(struct_name.field_2._M_local_buf + 8),(string *)&local_2998);
            std::__cxx11::string::~string((string *)&local_2998);
            std::__cxx11::string::~string((string *)&local_29b8);
          }
          std::operator+(&local_2a78,"  ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_218);
          std::operator+(&local_2a58,&local_2a78,".");
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2ab8,"add",&local_2ab9);
          IdlNamer::Method(&local_2a98,&this->namer_,&local_2ab8,s);
          std::operator+(&local_2a38,&local_2a58,&local_2a98);
          std::operator+(&local_2a18,&local_2a38,"(builder, ");
          std::operator+(&local_29f8,&local_2a18,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&field_default_val.field_2 + 8));
          std::operator+(&local_29d8,&local_29f8,");\n");
          std::__cxx11::string::operator+=
                    ((string *)(struct_name.field_2._M_local_buf + 8),(string *)&local_29d8);
          std::__cxx11::string::~string((string *)&local_29d8);
          std::__cxx11::string::~string((string *)&local_29f8);
          std::__cxx11::string::~string((string *)&local_2a18);
          std::__cxx11::string::~string((string *)&local_2a38);
          std::__cxx11::string::~string((string *)&local_2a98);
          std::__cxx11::string::~string((string *)&local_2ab8);
          std::allocator<char>::~allocator(&local_2ab9);
          std::__cxx11::string::~string((string *)&local_2a58);
          std::__cxx11::string::~string((string *)&local_2a78);
        }
        else {
          std::__cxx11::string::operator+=
                    ((string *)(struct_name.field_2._M_local_buf + 8),
                     (string *)(field_default_val.field_2._M_local_buf + 8));
        }
      }
      local_2ad0 = local_4e0._M_current;
      local_2ac8 = std::
                   next<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef**,std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>>>
                             (local_4e0,1);
      local_2ad8._M_current =
           (FieldDef **)
           std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                     (&(struct_def->fields).vec);
      bVar1 = __gnu_cxx::operator!=(&local_2ac8,&local_2ad8);
      if (bVar1) {
        std::__cxx11::string::operator+=(local_188,",\n");
        if (((struct_def->fixed & 1U) == 0) &&
           ((pack_func_prototype.field_2._M_local_buf[0xe] & 1U) != 0)) {
          std::__cxx11::string::operator+=
                    ((string *)(struct_name.field_2._M_local_buf + 8),",\n    ");
        }
        std::__cxx11::string::operator+=((string *)local_78,",\n");
        std::__cxx11::string::operator+=((string *)local_128,"\n");
      }
      else {
        std::__cxx11::string::operator+=(local_188,"\n");
        if ((struct_def->fixed & 1U) == 0) {
          cVar2 = std::__cxx11::string::empty();
          pcVar5 = "\n";
          if (cVar2 != '\0') {
            pcVar5 = "";
          }
          std::__cxx11::string::operator+=
                    ((string *)(pack_func_create_call.field_2._M_local_buf + 8),pcVar5);
          std::__cxx11::string::operator+=((string *)(struct_name.field_2._M_local_buf + 8),"\n  ");
        }
        std::__cxx11::string::operator+=((string *)local_78,"\n  ");
        std::__cxx11::string::operator+=((string *)local_128,"\n");
      }
      std::__cxx11::string::~string((string *)local_610);
      std::__cxx11::string::~string((string *)(field_default_val.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(field_offset_val.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(field_offset_decl.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(field_type.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_550);
      std::__cxx11::string::~string((string *)(field_binded_method.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(field_field.field_2._M_local_buf + 8));
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&local_4e0);
  }
  std::__cxx11::string::operator+=(local_188,"){}\n\n");
  if ((pack_func_prototype.field_2._M_local_buf[0xe] & 1U) == 0) {
    std::operator+(&local_2b58,"return ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218);
    std::operator+(&local_2b38,&local_2b58,".end");
    GetPrefixedName_abi_cxx11_(&local_2b78,this,struct_def,"");
    std::operator+(&local_2b18,&local_2b38,&local_2b78);
    std::operator+(&local_2af8,&local_2b18,"(builder);");
    std::__cxx11::string::operator+=
              ((string *)(struct_name.field_2._M_local_buf + 8),(string *)&local_2af8);
    std::__cxx11::string::~string((string *)&local_2af8);
    std::__cxx11::string::~string((string *)&local_2b18);
    std::__cxx11::string::~string((string *)&local_2b78);
    std::__cxx11::string::~string((string *)&local_2b38);
    std::__cxx11::string::~string((string *)&local_2b58);
  }
  else {
    std::__cxx11::string::operator+=((string *)(struct_name.field_2._M_local_buf + 8),");");
  }
  std::__cxx11::string::operator=((string *)obj_api_class,"\n");
  std::__cxx11::string::operator+=((string *)obj_api_class,"export class ");
  GetTypeName_abi_cxx11_(&local_2b98,this,struct_def,true,false);
  std::__cxx11::string::operator+=((string *)obj_api_class,(string *)&local_2b98);
  std::__cxx11::string::~string((string *)&local_2b98);
  std::__cxx11::string::operator+=
            ((string *)obj_api_class," implements flatbuffers.IGeneratedObject {\n");
  std::__cxx11::string::operator+=((string *)obj_api_class,local_188);
  std::operator+(&local_2bf8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&pack_func_create_call.field_2 + 8));
  std::operator+(&local_2bd8,&local_2bf8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&struct_name.field_2 + 8));
  std::operator+(&local_2bb8,&local_2bd8,"\n}");
  std::__cxx11::string::operator+=((string *)obj_api_class,(string *)&local_2bb8);
  std::__cxx11::string::~string((string *)&local_2bb8);
  std::__cxx11::string::~string((string *)&local_2bd8);
  std::__cxx11::string::~string((string *)&local_2bf8);
  std::__cxx11::string::operator+=((string *)obj_api_class,"\n}\n");
  std::__cxx11::string::operator+=((string *)local_78,");\n}");
  std::__cxx11::string::operator+=((string *)local_128,"}\n");
  std::operator+(&local_2c38,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                 "\n\n");
  std::operator+(&local_2c18,&local_2c38,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
  std::__cxx11::string::operator=((string *)obj_api_unpack_func,(string *)&local_2c18);
  std::__cxx11::string::~string((string *)&local_2c18);
  std::__cxx11::string::~string((string *)&local_2c38);
  std::__cxx11::string::~string((string *)local_218);
  std::__cxx11::string::~string((string *)(struct_name.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(pack_func_create_call.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_1b0);
  std::__cxx11::string::~string(local_188);
  std::__cxx11::string::~string((string *)local_128);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)(unpack_func.field_2._M_local_buf + 8));
  return;
}

Assistant:

void GenObjApi(const Parser &parser, StructDef &struct_def,
                 std::string &obj_api_unpack_func, std::string &obj_api_class,
                 import_set &imports) {
    const auto class_name = GetTypeName(struct_def, /*object_api=*/true);

    std::string unpack_func = "\nunpack(): " + class_name +
                              " {\n  return new " + class_name + "(" +
                              (struct_def.fields.vec.empty() ? "" : "\n");
    std::string unpack_to_func = "\nunpackTo(_o: " + class_name + "): void {" +
                                 +(struct_def.fields.vec.empty() ? "" : "\n");

    std::string constructor_func = "constructor(";
    constructor_func += (struct_def.fields.vec.empty() ? "" : "\n");

    const auto has_create =
        struct_def.fixed || CanCreateFactoryMethod(struct_def);

    std::string pack_func_prototype =
        "\npack(builder:flatbuffers.Builder): flatbuffers.Offset {\n";

    std::string pack_func_offset_decl;
    std::string pack_func_create_call;

    const auto struct_name = AddImport(imports, struct_def, struct_def).name;

    if (has_create) {
      pack_func_create_call = "  return " + struct_name + ".create" +
                              GetPrefixedName(struct_def) + "(builder" +
                              (struct_def.fields.vec.empty() ? "" : ",\n    ");
    } else {
      pack_func_create_call = "  " + struct_name + ".start" +
                              GetPrefixedName(struct_def) + "(builder);\n";
    }

    if (struct_def.fixed) {
      // when packing struct, nested struct's members instead of the struct's
      // offset are used
      pack_func_create_call +=
          GenStructMemberValueTS(struct_def, "this", ",\n    ", false) + "\n  ";
    }

    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;

      const auto field_method = namer_.Method(field);
      const auto field_field = namer_.Field(field);
      const std::string field_binded_method =
          "this." + field_method + ".bind(this)";

      std::string field_val;
      std::string field_type;
      // a string that declares a variable containing the
      // offset for things that can't be generated inline
      // empty otw
      std::string field_offset_decl;
      // a string that contains values for things that can be created inline or
      // the variable name from field_offset_decl
      std::string field_offset_val;
      const auto field_default_val = GenDefaultValue(field, imports);

      // Emit a scalar field
      const auto is_string = IsString(field.value.type);
      if (IsScalar(field.value.type.base_type) || is_string) {
        const auto has_null_default = is_string || HasNullDefault(field);

        field_type += GenTypeName(imports, field, field.value.type, false,
                                  has_null_default);
        field_val = "this." + namer_.Method(field) + "()";

        if (field.value.type.base_type != BASE_TYPE_STRING) {
          field_offset_val = "this." + namer_.Field(field);
        } else {
          field_offset_decl = GenNullCheckConditional(
              "this." + namer_.Field(field),
              "builder.createString(this." + field_field + "!)", "0");
        }
      }

      // Emit an object field
      else {
        auto is_vector = false;
        switch (field.value.type.base_type) {
          case BASE_TYPE_STRUCT: {
            const auto &sd = *field.value.type.struct_def;
            field_type += AddImport(imports, struct_def, sd).object_name;

            const std::string field_accessor =
                "this." + namer_.Method(field) + "()";
            field_val = GenNullCheckConditional(field_accessor,
                                                field_accessor + "!.unpack()");
            auto packing = GenNullCheckConditional(
                "this." + field_field,
                "this." + field_field + "!.pack(builder)", "0");

            if (sd.fixed) {
              field_offset_val = std::move(packing);
            } else {
              field_offset_decl = std::move(packing);
            }

            break;
          }

          case BASE_TYPE_ARRAY: {
            auto vectortype = field.value.type.VectorType();
            auto vectortypename =
                GenTypeName(imports, struct_def, vectortype, false);
            is_vector = true;

            field_type = "(";

            switch (vectortype.base_type) {
              case BASE_TYPE_STRUCT: {
                const auto &sd = *field.value.type.struct_def;
                const auto field_type_name =
                    GetTypeName(sd, /*object_api=*/true);
                field_type += field_type_name;
                field_type += ")[]";

                field_val = GenBBAccess() + ".createObjList<" + vectortypename +
                            ", " + field_type_name + ">(" +
                            field_binded_method + ", " +
                            NumToString(field.value.type.fixed_length) + ")";

                if (sd.fixed) {
                  field_offset_decl =
                      "builder.createStructOffsetList(this." + field_field +
                      ", " + AddImport(imports, struct_def, struct_def).name +
                      "." + namer_.Method("start", field, "Vector") + ")";
                } else {
                  field_offset_decl =
                      AddImport(imports, struct_def, struct_def).name + "." +
                      namer_.Method("create", field, "Vector") +
                      "(builder, builder.createObjectOffsetList(" + "this." +
                      field_field + "))";
                }

                break;
              }

              case BASE_TYPE_STRING: {
                field_type += "string)[]";
                field_val = GenBBAccess() + ".createScalarList<string>(" +
                            field_binded_method + ", this." +
                            namer_.Field(field, "Length") + "())";
                field_offset_decl =
                    AddImport(imports, struct_def, struct_def).name + "." +
                    namer_.Method("create", field, "Vector") +
                    "(builder, builder.createObjectOffsetList(" + "this." +
                    namer_.Field(field) + "))";
                break;
              }

              case BASE_TYPE_UNION: {
                field_type += GenObjApiUnionTypeTS(
                    imports, struct_def, parser.opts, *(vectortype.enum_def));
                field_type += ")[]";
                field_val = GenUnionValTS(imports, struct_def, field_method,
                                          vectortype, true);

                field_offset_decl =
                    AddImport(imports, struct_def, struct_def).name + "." +
                    namer_.Method("create", field, "Vector") +
                    "(builder, builder.createObjectOffsetList(" + "this." +
                    namer_.Field(field) + "))";

                break;
              }
              default: {
                if (vectortype.enum_def) {
                  field_type += GenTypeName(imports, struct_def, vectortype,
                                            false, HasNullDefault(field));
                } else {
                  field_type += vectortypename;
                }
                field_type += ")[]";
                field_val = GenBBAccess() + ".createScalarList<" +
                            vectortypename + ">(" + field_binded_method + ", " +
                            NumToString(field.value.type.fixed_length) + ")";

                field_offset_decl =
                    AddImport(imports, struct_def, struct_def).name + "." +
                    namer_.Method("create", field, "Vector") +
                    "(builder, this." + field_field + ")";

                break;
              }
            }

            break;
          }

          case BASE_TYPE_VECTOR: {
            auto vectortype = field.value.type.VectorType();
            auto vectortypename =
                GenTypeName(imports, struct_def, vectortype, false);
            is_vector = true;

            field_type = "(";

            switch (vectortype.base_type) {
              case BASE_TYPE_STRUCT: {
                const auto &sd = *field.value.type.struct_def;
                const auto field_type_name =
                    GetTypeName(sd, /*object_api=*/true);
                field_type += field_type_name;
                field_type += ")[]";

                field_val = GenBBAccess() + ".createObjList<" + vectortypename +
                            ", " + field_type_name + ">(" +
                            field_binded_method + ", this." +
                            namer_.Method(field, "Length") + "())";

                if (sd.fixed) {
                  field_offset_decl =
                      "builder.createStructOffsetList(this." + field_field +
                      ", " + AddImport(imports, struct_def, struct_def).name +
                      "." + namer_.Method("start", field, "Vector") + ")";
                } else {
                  field_offset_decl =
                      AddImport(imports, struct_def, struct_def).name + "." +
                      namer_.Method("create", field, "Vector") +
                      "(builder, builder.createObjectOffsetList(" + "this." +
                      field_field + "))";
                }

                break;
              }

              case BASE_TYPE_STRING: {
                field_type += "string)[]";
                field_val = GenBBAccess() + ".createScalarList<string>(" +
                            field_binded_method + ", this." +
                            namer_.Field(field, "Length") + "())";
                field_offset_decl =
                    AddImport(imports, struct_def, struct_def).name + "." +
                    namer_.Method("create", field, "Vector") +
                    "(builder, builder.createObjectOffsetList(" + "this." +
                    namer_.Field(field) + "))";
                break;
              }

              case BASE_TYPE_UNION: {
                field_type += GenObjApiUnionTypeTS(
                    imports, struct_def, parser.opts, *(vectortype.enum_def));
                field_type += ")[]";
                field_val = GenUnionValTS(imports, struct_def, field_method,
                                          vectortype, true);

                field_offset_decl =
                    AddImport(imports, struct_def, struct_def).name + "." +
                    namer_.Method("create", field, "Vector") +
                    "(builder, builder.createObjectOffsetList(" + "this." +
                    namer_.Field(field) + "))";

                break;
              }
              default: {
                if (vectortype.enum_def) {
                  field_type += GenTypeName(imports, struct_def, vectortype,
                                            false, HasNullDefault(field));
                } else {
                  field_type += vectortypename;
                }
                field_type += ")[]";
                field_val = GenBBAccess() + ".createScalarList<" +
                            vectortypename + ">(" + field_binded_method +
                            ", this." + namer_.Method(field, "Length") + "())";

                field_offset_decl =
                    AddImport(imports, struct_def, struct_def).name + "." +
                    namer_.Method("create", field, "Vector") +
                    "(builder, this." + field_field + ")";

                break;
              }
            }

            break;
          }

          case BASE_TYPE_UNION: {
            field_type += GenObjApiUnionTypeTS(imports, struct_def, parser.opts,
                                               *(field.value.type.enum_def));

            field_val = GenUnionValTS(imports, struct_def, field_method,
                                      field.value.type);
            field_offset_decl =
                "builder.createObjectOffset(this." + field_field + ")";
            break;
          }

          default: FLATBUFFERS_ASSERT(0); break;
        }

        // length 0 vector is simply empty instead of null
        field_type += is_vector ? "" : "|null";
      }

      if (!field_offset_decl.empty()) {
        field_offset_decl =
            "  const " + field_field + " = " + field_offset_decl + ";";
      }
      if (field_offset_val.empty()) { field_offset_val = field_field; }

      unpack_func += "    " + field_val;
      unpack_to_func += "  _o." + field_field + " = " + field_val + ";";

      // FIXME: if field_type and field_field are identical, then
      // this generates invalid typescript.
      constructor_func += "  public " + field_field + ": " + field_type +
                          " = " + field_default_val;

      if (!struct_def.fixed) {
        if (!field_offset_decl.empty()) {
          pack_func_offset_decl += field_offset_decl + "\n";
        }

        if (has_create) {
          pack_func_create_call += field_offset_val;
        } else {
          if (field.IsScalarOptional()) {
            pack_func_create_call +=
                "  if (" + field_offset_val + " !== null)\n  ";
          }
          pack_func_create_call += "  " + struct_name + "." +
                                   namer_.Method("add", field) + "(builder, " +
                                   field_offset_val + ");\n";
        }
      }

      if (std::next(it) != struct_def.fields.vec.end()) {
        constructor_func += ",\n";

        if (!struct_def.fixed && has_create) {
          pack_func_create_call += ",\n    ";
        }

        unpack_func += ",\n";
        unpack_to_func += "\n";
      } else {
        constructor_func += "\n";
        if (!struct_def.fixed) {
          pack_func_offset_decl += (pack_func_offset_decl.empty() ? "" : "\n");
          pack_func_create_call += "\n  ";
        }

        unpack_func += "\n  ";
        unpack_to_func += "\n";
      }
    }

    constructor_func += "){}\n\n";

    if (has_create) {
      pack_func_create_call += ");";
    } else {
      pack_func_create_call += "return " + struct_name + ".end" +
                               GetPrefixedName(struct_def) + "(builder);";
    }
    obj_api_class = "\n";
    obj_api_class += "export class ";
    obj_api_class += GetTypeName(struct_def, /*object_api=*/true);
    obj_api_class += " implements flatbuffers.IGeneratedObject {\n";
    obj_api_class += constructor_func;
    obj_api_class += pack_func_prototype + pack_func_offset_decl +
                     pack_func_create_call + "\n}";

    obj_api_class += "\n}\n";

    unpack_func += ");\n}";
    unpack_to_func += "}\n";

    obj_api_unpack_func = unpack_func + "\n\n" + unpack_to_func;
  }